

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dblp_std.cpp
# Opt level: O0

void __thiscall XMLElement::XMLElement(XMLElement *this,SymbolContext<char> *ctx)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__x;
  XMLElementBody *old;
  XMLElementBody *body_ptr;
  XMLAttribute *attr;
  int i;
  string *name_str;
  SymbolContext<char> *ctx_local;
  XMLElement *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->m_attributes);
  XMLElementBody::XMLElementBody(&this->m_body);
  this_00 = Centaurus::SymbolContext<char>::value<std::__cxx11::string>(ctx,1);
  std::__cxx11::string::operator=((string *)this,(string *)this_00);
  if (this_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::__cxx11::string::~string((string *)this_00);
    operator_delete(this_00);
  }
  attr._4_4_ = 2;
  while( true ) {
    iVar1 = Centaurus::SymbolContext<char>::count(ctx);
    if (iVar1 + -1 < attr._4_4_) break;
    __x = Centaurus::SymbolContext<char>::
          value<std::pair<std::__cxx11::string,std::__cxx11::string>>(ctx,attr._4_4_);
    std::
    map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>&>
              ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&this->m_attributes,__x);
    if (__x != (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x0) {
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(__x);
      operator_delete(__x);
    }
    attr._4_4_ = attr._4_4_ + 1;
  }
  iVar1 = Centaurus::SymbolContext<char>::count(ctx);
  old = Centaurus::SymbolContext<char>::value<XMLElementBody>(ctx,iVar1);
  XMLElementBody::operator=(&this->m_body,old);
  if (old != (XMLElementBody *)0x0) {
    XMLElementBody::~XMLElementBody(old);
    operator_delete(old);
  }
  return;
}

Assistant:

XMLElement(const SymbolContext<char>& ctx)
    {
        std::string *name_str = ctx.value<std::string>(1);
        m_name = std::move(*name_str);
        delete name_str;
        for (int i = 2; i <= ctx.count() - 1; i++)
        {
            XMLAttribute *attr = ctx.value<XMLAttribute>(i);
            m_attributes.insert(*attr);
            delete attr;
        }
        XMLElementBody *body_ptr = ctx.value<XMLElementBody>(ctx.count());
        m_body = std::move(*body_ptr);
        delete body_ptr;
    }